

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O0

void __thiscall
IntervalsTest_TestOverlapDescendingSequence_Test::~IntervalsTest_TestOverlapDescendingSequence_Test
          (IntervalsTest_TestOverlapDescendingSequence_Test *this)

{
  IntervalsTest_TestOverlapDescendingSequence_Test *this_local;
  
  ~IntervalsTest_TestOverlapDescendingSequence_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(IntervalsTest, TestOverlapDescendingSequence) {
  std::vector<Interval> intervals;
  intervals.emplace_back(9, 15, 5);
  intervals.emplace_back(8, 11, 1);
  intervals.emplace_back(3, 15, 5);
  intervals.emplace_back(3, 6, 2);
  intervals.emplace_back(2, 10, 3);
  intervals.emplace_back(0, 3, 6);
  std::vector<int> expected{5, 2};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}